

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_SET_OF.c
# Opt level: O2

int SET_OF_xer_order(void *aptr,void *bptr)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  ulong __n;
  
  uVar1 = *(ulong *)((long)aptr + 8);
  uVar2 = *(ulong *)((long)bptr + 8);
  __n = uVar1;
  if (uVar2 < uVar1) {
    __n = uVar2;
  }
  iVar3 = memcmp(*aptr,*bptr,__n);
  if ((iVar3 == 0) && (iVar3 = 0, uVar1 != uVar2)) {
    iVar3 = (uint)(uVar1 != __n) * 2 + -1;
  }
  return iVar3;
}

Assistant:

static int
SET_OF_xer_order(const void *aptr, const void *bptr) {
	const xer_tmp_enc_t *a = (const xer_tmp_enc_t *)aptr;
	const xer_tmp_enc_t *b = (const xer_tmp_enc_t *)bptr;
	size_t minlen = a->offset;
	int ret;
	if(b->offset < minlen) minlen = b->offset;
	/* Well-formed UTF-8 has this nice lexicographical property... */
	ret = memcmp(a->buffer, b->buffer, minlen);
	if(ret != 0) return ret;
	if(a->offset == b->offset)
		return 0;
	if(a->offset == minlen)
		return -1;
	return 1;
}